

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

string * __thiscall pbrt::Image::ToString_abi_cxx11_(string *__return_storage_ptr__,Image *this)

{
  long lVar1;
  string local_58;
  char *local_38;
  
  lVar1 = (this->encoding).
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          .bits << 0x10;
  if (lVar1 == 0) {
    local_38 = "(nullptr)";
  }
  else {
    ColorEncodingHandle::ToString_abi_cxx11_(&local_58,&this->encoding);
    local_38 = local_58._M_dataplus._M_p;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::PixelFormat_const&,pbrt::Point2<int>const&,pstd::vector<std::__cxx11::string,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>const&,char_const*>
            (__return_storage_ptr__,
             "[ Image format: %s resolution: %s channelNames: %s encoding: %s ]",&this->format,
             &this->resolution,&this->channelNames,&local_38);
  if ((lVar1 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2)) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Image::ToString() const {
    return StringPrintf("[ Image format: %s resolution: %s channelNames: %s "
                        "encoding: %s ]",
                        format, resolution, channelNames,
                        encoding ? encoding.ToString().c_str() : "(nullptr)");
}